

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O2

void __thiscall TypeFactory::saveXmlCoreTypes(TypeFactory *this,ostream *s)

{
  long *plVar1;
  _Base_ptr p_Var2;
  
  std::operator<<(s,"<coretypes>\n");
  for (p_Var2 = (this->tree)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->tree)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    plVar1 = *(long **)(p_Var2 + 1);
    if (((*(byte *)((long)plVar1 + 0x34) & 1) != 0) && (2 < *(uint *)(plVar1 + 6))) {
      std::operator<<(s,' ');
      (**(code **)(*plVar1 + 0x58))(plVar1,s);
      std::operator<<(s,'\n');
    }
  }
  std::operator<<(s,"</coretypes>\n");
  return;
}

Assistant:

void TypeFactory::saveXmlCoreTypes(ostream &s) const

{
  DatatypeSet::const_iterator iter;
  Datatype *ct;

  s << "<coretypes>\n";
  for(iter=tree.begin();iter!=tree.end();++iter) {
    ct = *iter;
    if (!ct->isCoreType()) continue;
    type_metatype meta = ct->getMetatype();
    if ((meta==TYPE_PTR)||(meta==TYPE_ARRAY)||
	(meta==TYPE_STRUCT))
      continue;
    s << ' ';
    ct->saveXml(s);
    s << '\n';
  }
  s << "</coretypes>\n";
}